

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O0

snd_pcm_uframes_t get_buffer_size(void)

{
  undefined8 uVar1;
  char *__nptr;
  int n;
  char *val;
  int local_14;
  snd_pcm_uframes_t local_8;
  
  uVar1 = al_get_system_config();
  __nptr = (char *)al_get_config_value(uVar1,"alsa","buffer_size2");
  if ((__nptr == (char *)0x0) || (*__nptr == '\0')) {
    local_8 = 0x800;
  }
  else {
    local_14 = atoi(__nptr);
    if (local_14 < 1) {
      local_14 = 1;
    }
    local_8 = (snd_pcm_uframes_t)local_14;
  }
  return local_8;
}

Assistant:

static snd_pcm_uframes_t get_buffer_size(void)
{
   const char *val = al_get_config_value(al_get_system_config(),
      "alsa", "buffer_size2");
   if (val && val[0] != '\0') {
      int n = atoi(val);
      if (n < 1)
         n = 1;
      return n;
   }

   return DEFAULT_BUFFER_SIZE;
}